

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::unregister(CoreBroker *this)

{
  char *pcVar1;
  string_view brokerName;
  string_view brokerName_00;
  shared_ptr<helics::Broker> keepBrokerAlive2;
  shared_ptr<helics::Broker> keepBrokerAlive;
  long local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  long local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  brokerName._M_str = (char *)(this->super_BrokerBase).identifier._M_string_length;
  brokerName._M_len = (size_t)&local_20;
  BrokerFactory::findBroker(brokerName);
  if (local_20 != 0) {
    BrokerFactory::unregisterBroker
              ((string_view)
               keepBrokerAlive2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>);
  }
  pcVar1 = (char *)(this->mPreviousLocalBrokerIdentifier)._M_string_length;
  if (pcVar1 != (char *)0x0) {
    brokerName_00._M_str = pcVar1;
    brokerName_00._M_len = (size_t)&local_30;
    BrokerFactory::findBroker(brokerName_00);
    if (local_30 != 0) {
      BrokerFactory::unregisterBroker
                ((string_view)
                 keepBrokerAlive2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>);
    }
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void CoreBroker::unregister()
{
    /*We need to ensure that the destructor is not called immediately upon calling unregister
    otherwise this would be a mess and probably cause segmentation faults so we capture it in a
    local variable that will be destroyed on function exit
    */
    auto keepBrokerAlive = BrokerFactory::findBroker(identifier);
    if (keepBrokerAlive) {
        BrokerFactory::unregisterBroker(identifier);
    }
    if (!mPreviousLocalBrokerIdentifier.empty()) {
        auto keepBrokerAlive2 = BrokerFactory::findBroker(mPreviousLocalBrokerIdentifier);
        if (keepBrokerAlive2) {
            BrokerFactory::unregisterBroker(mPreviousLocalBrokerIdentifier);
        }
    }
}